

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O3

void __thiscall
aeron::archive::AeronArchive::awaitConnection(AeronArchive *this,TimePoint *deadline)

{
  long lVar1;
  byte *pbVar2;
  long local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  ControlResponsePoller::subscription
            ((this->controlResponsePoller_)._M_t.
             super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
             ._M_t.
             super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
             .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>._M_head_impl);
  lVar1 = (*(long **)(local_18 + 0x50))[1];
  if (lVar1 != 0) {
    pbVar2 = (byte *)(**(long **)(local_18 + 0x50) + 0xd0);
    do {
      lVar1 = lVar1 + -1;
      if ((*pbVar2 & 1) == 0) break;
      pbVar2 = pbVar2 + 0x128;
    } while (lVar1 != 0);
  }
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  return;
}

Assistant:

void AeronArchive::stopRecording(const std::string& channel, std::int32_t streamId) {
    callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->stopRecording(channel, streamId, correlationId, controlSessionId_);
        },
        "stop recording");
}